

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderAdjacencyTests::setLineStripPointsNonindiced
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  long lVar1;
  AdjacencyGrid *pAVar2;
  AdjacencyGridPoint *pAVar3;
  GLfloat *pGVar4;
  GLfloat *pGVar5;
  GLfloat *pGVar6;
  GLfloat *pGVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  
  pAVar2 = test_data->m_grid;
  uVar9 = (pAVar2->m_line_strip).m_n_points;
  test_data->m_n_vertices = uVar9;
  uVar13 = (uVar9 * 8 + -0x18) * this->m_n_components_output;
  test_data->m_geometry_bo_size = uVar13;
  uVar12 = this->m_n_components_input * uVar9 * 4;
  test_data->m_vertex_data_bo_size = uVar12;
  pGVar4 = (GLfloat *)operator_new__((ulong)uVar13);
  test_data->m_expected_adjacency_geometry = pGVar4;
  pGVar5 = (GLfloat *)operator_new__((ulong)uVar13);
  test_data->m_expected_geometry = pGVar5;
  pGVar6 = (GLfloat *)operator_new__((ulong)uVar12);
  test_data->m_vertex_data = pGVar6;
  if ((ulong)uVar9 == 0) {
    uVar9 = 0xfffffffd;
  }
  else {
    pGVar7 = &((pAVar2->m_line_strip).m_points)->y;
    uVar8 = 0;
    do {
      pGVar6[uVar8 * 2] = pGVar7[-1];
      pGVar6[uVar8 * 2 + 1] = *pGVar7;
      uVar8 = uVar8 + 1;
      pGVar7 = pGVar7 + 3;
    } while (uVar9 != uVar8);
    uVar9 = uVar9 - 3;
    if (uVar9 == 0) {
      return;
    }
  }
  pAVar3 = (pAVar2->m_line_strip).m_points;
  pGVar6 = &pAVar3[1].y;
  uVar8 = 2;
  lVar10 = 0;
  do {
    *(GLfloat *)((long)pGVar4 + lVar10) = pGVar6[-4];
    *(GLfloat *)((long)pGVar4 + lVar10 + 4) = pGVar6[-3];
    *(undefined8 *)((long)pGVar4 + lVar10 + 8) = 0x3f80000000000000;
    uVar11 = uVar8 & 0xffffffff;
    lVar1 = (1 - (ulong)uVar9) + uVar8;
    uVar8 = uVar8 + 1;
    *(GLfloat *)((long)pGVar4 + lVar10 + 0x10) = pAVar3[uVar8 & 0xffffffff].x;
    *(GLfloat *)((long)pGVar4 + lVar10 + 0x14) = pAVar3[uVar8 & 0xffffffff].y;
    *(undefined8 *)((long)pGVar4 + lVar10 + 0x18) = 0x3f80000000000000;
    *(GLfloat *)((long)pGVar5 + lVar10) = pGVar6[-1];
    *(GLfloat *)((long)pGVar5 + lVar10 + 4) = *pGVar6;
    *(undefined8 *)((long)pGVar5 + lVar10 + 8) = 0x3f80000000000000;
    *(GLfloat *)((long)pGVar5 + lVar10 + 0x10) = pAVar3[uVar11].x;
    *(GLfloat *)((long)pGVar5 + lVar10 + 0x14) = pAVar3[uVar11].y;
    *(undefined8 *)((long)pGVar5 + lVar10 + 0x18) = 0x3f80000000000000;
    pGVar6 = pGVar6 + 3;
    lVar10 = lVar10 + 0x20;
  } while (lVar1 != 2);
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::setLineStripPointsNonindiced(AdjacencyTestData& test_data)
{
	float* travellerExpectedAdjacencyGeometryPtr = 0;
	float* travellerExpectedGeometryPtr			 = 0;
	float* travellerPtr							 = 0;

	/* Set buffer sizes */
	test_data.m_n_vertices		 = test_data.m_grid->m_line_strip.m_n_points;
	test_data.m_geometry_bo_size = static_cast<glw::GLuint>((test_data.m_n_vertices - 3) * m_n_components_output *
															2 /* start/end */ * sizeof(float));
	test_data.m_vertex_data_bo_size =
		static_cast<glw::GLuint>(test_data.m_n_vertices * m_n_components_input * sizeof(float));

	/* Allocate memory for input and expected data */
	test_data.m_expected_adjacency_geometry = new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_expected_geometry			= new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_vertex_data					= new float[test_data.m_vertex_data_bo_size / sizeof(float)];

	travellerExpectedAdjacencyGeometryPtr = test_data.m_expected_adjacency_geometry;
	travellerExpectedGeometryPtr		  = test_data.m_expected_geometry;
	travellerPtr						  = test_data.m_vertex_data;

	/* Set input and expected values */
	for (unsigned int n = 0; n < test_data.m_n_vertices; ++n)
	{
		*travellerPtr = test_data.m_grid->m_line_strip.m_points[n].x;
		++travellerPtr;
		*travellerPtr = test_data.m_grid->m_line_strip.m_points[n].y;
		++travellerPtr;
	}

	for (unsigned int n = 0; n < test_data.m_n_vertices - 3; ++n)
	{
		*travellerExpectedAdjacencyGeometryPtr = test_data.m_grid->m_line_strip.m_points[n].x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = test_data.m_grid->m_line_strip.m_points[n].y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 3].x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 3].y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;

		*travellerExpectedGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 1].x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 1].y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 2].x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 2].y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
	} /* for (all vertices (apart from the three last ones) ) */
}